

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snapshot.cpp
# Opt level: O3

RealType __thiscall OpenMD::Snapshot::getPotentialEnergy(Snapshot *this)

{
  int i;
  long lVar1;
  RealType RVar2;
  double dVar3;
  RealType RVar4;
  RealType RVar5;
  RealType RVar6;
  
  if (this->hasPotentialEnergy == true) {
    return (this->frameData).potentialEnergy;
  }
  if (this->hasLongRangePotential == true) {
    RVar2 = (this->frameData).longRangePotential;
  }
  else {
    dVar3 = 0.0;
    lVar1 = 0;
    do {
      dVar3 = dVar3 + (this->frameData).lrPotentials.data_[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 7);
    RVar2 = dVar3 + (this->frameData).reciprocalPotential + (this->frameData).surfacePotential;
    (this->frameData).longRangePotential = RVar2;
    this->hasLongRangePotential = true;
  }
  if (this->hasShortRangePotential == true) {
    RVar4 = (this->frameData).shortRangePotential;
  }
  else {
    RVar4 = (this->frameData).bondPotential + (this->frameData).bendPotential +
            (this->frameData).torsionPotential + (this->frameData).inversionPotential;
    (this->frameData).shortRangePotential = RVar4;
    this->hasShortRangePotential = true;
  }
  if (this->hasSelfPotential == true) {
    RVar5 = (this->frameData).selfPotential;
  }
  else {
    RVar5 = 0.0;
    lVar1 = 0;
    do {
      RVar5 = RVar5 + (this->frameData).selfPotentials.data_[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 7);
    (this->frameData).selfPotential = RVar5;
    this->hasSelfPotential = true;
  }
  if (this->hasExcludedPotential == true) {
    RVar6 = (this->frameData).excludedPotential;
  }
  else {
    RVar6 = 0.0;
    lVar1 = 0;
    do {
      RVar6 = RVar6 + (this->frameData).excludedPotentials.data_[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 7);
    (this->frameData).excludedPotential = RVar6;
    this->hasExcludedPotential = true;
  }
  dVar3 = RVar2 + RVar4 + RVar5 + RVar6;
  (this->frameData).potentialEnergy = dVar3;
  this->hasPotentialEnergy = true;
  this->hasTotalEnergy = false;
  return dVar3;
}

Assistant:

RealType Snapshot::getPotentialEnergy() {
    if (!hasPotentialEnergy) {
      frameData.potentialEnergy = this->getLongRangePotential();
      frameData.potentialEnergy += this->getShortRangePotential();
      frameData.potentialEnergy += this->getSelfPotential();
      frameData.potentialEnergy += this->getExcludedPotential();
      hasPotentialEnergy = true;
      hasTotalEnergy     = false;
    }
    return frameData.potentialEnergy;
  }